

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

Emb_Man_t * Emb_ManStart(Gia_Man_t *pGia)

{
  Emb_Obj_t *pEVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  int iVar7;
  Emb_Man_t *pEVar8;
  Vec_Int_t *p;
  int *piVar9;
  Vec_Int_t *p_00;
  uint *puVar10;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  int nFanios;
  int nObjs;
  int local_48;
  uint local_44;
  Vec_Int_t *local_40;
  ulong local_38;
  
  Emb_ManCreateRefsSpecial(pGia);
  Emb_ManTransformRefs(pGia,(int *)&local_44,&local_48);
  Gia_ManFillValue(pGia);
  pEVar8 = (Emb_Man_t *)calloc(1,0x68);
  pEVar8->pGia = pGia;
  iVar19 = pGia->nRegs;
  pEVar8->nRegs = iVar19;
  iVar7 = pGia->vCis->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  if (iVar7 - 1U < 0xf) {
    iVar7 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar7 << 2);
  }
  p->pArray = piVar9;
  pEVar8->vCis = p;
  pVVar11 = pGia->vCos;
  iVar7 = pVVar11->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar20 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar20 = iVar7;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar20;
  if (iVar20 == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)malloc((long)iVar20 << 2);
  }
  p_00->pArray = piVar9;
  pEVar8->vCos = p_00;
  local_38 = (ulong)local_44;
  uVar16 = pVVar11->nSize;
  uVar4 = local_44 * 5 + (iVar19 + local_48 + uVar16) * 2;
  pEVar8->nObjData = uVar4;
  puVar10 = (uint *)calloc((long)(int)uVar4,4);
  pEVar8->pObjData = (int *)puVar10;
  pGia->pObjs->Value = 0;
  puVar10[2] = 0;
  *puVar10 = *puVar10 & 0xf | uVar16 << 4;
  if (pGia->nObjs < 1) {
LAB_006860d2:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar14 = *pGia->pRefs;
  puVar10[1] = uVar14;
  pEVar8->nObjs = pEVar8->nObjs + 1;
  uVar16 = uVar14 + (uVar16 & 0xfffffff) + 5;
  pVVar11 = pGia->vCis;
  if (0 < pVVar11->nSize) {
    lVar21 = 0;
    do {
      iVar19 = pVVar11->pArray[lVar21];
      if (((long)iVar19 < 0) || (pGia->nObjs <= iVar19)) goto LAB_006860b3;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGia->pObjs + iVar19;
      pGVar6->Value = uVar16;
      Vec_IntPush(p,uVar16);
      puVar10[(ulong)uVar16 + 2] = uVar16;
      uVar14 = 0;
      if ((~(uint)*(undefined8 *)pGVar6 & 0x9fffffff) == 0) {
        uVar14 = (uint)(pGia->vCis->nSize - pGia->nRegs <=
                       (int)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x20) & 0x1fffffff)) << 4;
      }
      uVar15 = puVar10[uVar16] & 0xf | uVar14;
      puVar10[uVar16] = uVar15;
      pGVar5 = pGia->pObjs;
      if ((pGVar6 < pGVar5) || (pGVar5 + pGia->nObjs <= pGVar6)) goto LAB_006860d2;
      uVar17 = pGia->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555];
      puVar10[(ulong)uVar16 + 1] = uVar17;
      puVar10[uVar16] = uVar15 | 1;
      uVar16 = uVar16 + (uVar14 >> 4) + uVar17 + 5;
      pEVar8->nObjs = pEVar8->nObjs + 1;
      lVar21 = lVar21 + 1;
      pVVar11 = pGia->vCis;
    } while (lVar21 < pVVar11->nSize);
  }
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 100;
  pVVar11->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar11->pArray = piVar9;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  piVar9 = (int *)malloc(400);
  pVVar12->pArray = piVar9;
  uVar13 = (ulong)(uint)pGia->nObjs;
  iVar19 = 1;
  local_40 = pVVar12;
  if (0 < pGia->nObjs) {
    lVar21 = 0;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGia->pObjs + lVar21;
      uVar14 = (uint)*(undefined8 *)pGVar6;
      if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
        if ((uVar14 >> 0x1e & 1) == 0) {
          if ((int)uVar13 <= lVar21) goto LAB_006860d2;
          if (pGia->pRefs[lVar21] != 0) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                          ,0x222,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
          }
        }
        else {
          if ((int)uVar13 <= lVar21) goto LAB_006860d2;
          if (pGia->pRefs[lVar21] < 1) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                          ,0x225,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
          }
          Emb_ManCollectSuper(pGia,pGVar6,pVVar11,local_40);
          pGVar6->Value = uVar16;
          puVar10[(ulong)uVar16 + 2] = uVar16;
          puVar10[uVar16] = puVar10[uVar16] & 0xf | pVVar11->nSize << 4;
          pGVar5 = pGia->pObjs;
          if ((pGVar6 < pGVar5) || (pGVar5 + pGia->nObjs <= pGVar6)) goto LAB_006860d2;
          pEVar1 = (Emb_Obj_t *)(puVar10 + uVar16);
          pEVar1->nFanouts =
               pGia->pRefs[(int)((ulong)((long)pGVar6 - (long)pGVar5) >> 2) * -0x55555555];
          if (0 < pVVar11->nSize) {
            lVar18 = 0;
            do {
              iVar7 = pVVar11->pArray[lVar18];
              if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_006860b3;
              if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
              Emb_ObjAddFanin(pEVar1,(Emb_Obj_t *)(puVar10 + pGia->pObjs[iVar7].Value));
              lVar18 = lVar18 + 1;
            } while (lVar18 < pVVar11->nSize);
          }
          uVar16 = uVar16 + (*(uint *)pEVar1 >> 4) + pEVar1->nFanouts + 5;
          iVar19 = iVar19 + 1;
          pEVar8->nObjs = pEVar8->nObjs + 1;
        }
      }
      lVar21 = lVar21 + 1;
      uVar13 = (ulong)pGia->nObjs;
    } while (lVar21 < (long)uVar13);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  pVVar11 = local_40;
  if (local_40->pArray != (int *)0x0) {
    free(local_40->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  pVVar11 = pGia->vCos;
  if (0 < pVVar11->nSize) {
    lVar21 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar21];
      if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_006860b3;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pGia->pObjs + iVar7;
      pGVar6->Value = uVar16;
      Vec_IntPush(p_00,uVar16);
      puVar10[(ulong)uVar16 + 2] = uVar16;
      uVar14 = puVar10[uVar16];
      puVar10[uVar16] = (uVar14 & 0xf) + 0x10;
      uVar15 = (uint)*(undefined8 *)pGVar6;
      uVar17 = 1;
      if ((~uVar15 & 0x1fffffff) != 0 && (int)uVar15 < 0) {
        uVar17 = (pGia->vCos->nSize - pGia->nRegs <=
                 (int)((uint)((ulong)*(undefined8 *)pGVar6 >> 0x20) & 0x1fffffff)) + 1;
      }
      pEVar1 = (Emb_Obj_t *)(puVar10 + uVar16);
      pEVar1->nFanouts = uVar17;
      *(uint *)pEVar1 = uVar14 & 0xf | 0x12;
      Emb_ObjAddFanin(pEVar1,(Emb_Obj_t *)
                             (puVar10 +
                             pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value));
      uVar16 = uVar16 + (*(uint *)pEVar1 >> 4) + pEVar1->nFanouts + 5;
      pEVar8->nObjs = pEVar8->nObjs + 1;
      lVar21 = lVar21 + 1;
      pVVar11 = pGia->vCos;
    } while (lVar21 < pVVar11->nSize);
  }
  iVar7 = pGia->nRegs;
  if (0 < iVar7) {
    iVar20 = 0;
LAB_00685f07:
    iVar2 = pGia->vCos->nSize;
    uVar14 = (iVar2 - iVar7) + iVar20;
    if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) {
LAB_006860f1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar2 = pGia->vCos->pArray[uVar14];
    if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) {
LAB_006860b3:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar6 = pGia->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      iVar3 = pGia->vCis->nSize;
      uVar14 = (iVar3 - iVar7) + iVar20;
      if (((int)uVar14 < 0) || (iVar3 <= (int)uVar14)) goto LAB_006860f1;
      iVar7 = pGia->vCis->pArray[uVar14];
      if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_006860b3;
      Emb_ObjAddFanin((Emb_Obj_t *)(puVar10 + pGVar6[iVar7].Value),
                      (Emb_Obj_t *)(puVar10 + pGVar6[iVar2].Value));
      iVar20 = iVar20 + 1;
      iVar7 = pGia->nRegs;
      if (iVar20 < iVar7) goto LAB_00685f07;
    }
  }
  Gia_ManCleanMark0(pGia);
  if (iVar19 != pEVar8->nObjs - (p->nSize + p_00->nSize)) {
    __assert_fail("nNodes == Emb_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x250,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if ((int)local_38 != pEVar8->nObjs) {
    __assert_fail("nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x251,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  if (uVar16 != uVar4) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x252,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
  }
  uVar4 = pGia->nObjs;
  if ((0 < (int)uVar4) && (pGVar6 = pGia->pObjs, pGVar6 != (Gia_Obj_t *)0x0)) {
    lVar21 = 0;
    do {
      uVar13 = (ulong)*(uint *)((long)&pGVar6->Value + lVar21);
      if (uVar13 != 0xffffffff) {
        if ((puVar10[uVar13] >> 4 != puVar10[uVar13 + 3]) &&
           ((~*(ulong *)(&pGVar6->field_0x0 + lVar21) & 0x1fffffff1fffffff) != 0)) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin || Gia_ObjIsConst0(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                        ,0x25b,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
        if ((puVar10[uVar13 + 1] != puVar10[uVar13 + 4]) &&
           ((uVar16 = (uint)*(undefined8 *)(&pGVar6->field_0x0 + lVar21), -1 < (int)uVar16 ||
            ((uVar16 & 0x1fffffff) == 0x1fffffff)))) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                        ,0x25c,"Emb_Man_t *Emb_ManStart(Gia_Man_t *)");
        }
        (puVar10 + uVar13 + 3)[0] = 0;
        (puVar10 + uVar13 + 3)[1] = 0;
      }
      lVar21 = lVar21 + 0xc;
    } while ((ulong)uVar4 * 0xc != lVar21);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pEVar8;
}

Assistant:

Emb_Man_t * Emb_ManStart( Gia_Man_t * pGia )
{
    Emb_Man_t * p;
    Emb_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo, * pFanin;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Emb_ManCreateRefsSpecial( pGia );
    Emb_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Emb_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Emb_Obj_t) / 4) * nObjs + 2 * (nFanios + Gia_ManRegNum(pGia) + Gia_ManCoNum(pGia));
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Emb_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = Gia_ManCoNum(pGia);  //0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Emb_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Gia_ObjIsRo( pGia, pObj );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Emb_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Emb_ManObj( p, Gia_ObjValue(pFanin) ); 
            Emb_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Emb_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 1 + Gia_ObjIsRi( pGia, pObj );
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Emb_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Emb_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Emb_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
        Emb_ObjAddFanin( Emb_ManObj(p,Gia_ObjValue(pObjRo)), Emb_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Emb_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Emb_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Emb_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin || Gia_ObjIsConst0(pObj) );
        assert( pObjLog->nFanouts == pObjLog->iFanout || Gia_ObjIsCo(pObj) );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}